

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_cursor_data_callback
              (unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
              void *pUserData)

{
  int iVar1;
  int rc;
  void *pUserData_local;
  _func_int_void_ptr_uint_void_ptr *xConsumer_local;
  unqlite_kv_cursor *pCursor_local;
  
  iVar1 = (*pCursor->pStore->pIo->pMethods->xData)(pCursor,xConsumer,pUserData);
  return iVar1;
}

Assistant:

int unqlite_kv_cursor_data_callback(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	/* Consume the data directly */
	rc = pCursor->pStore->pIo->pMethods->xData(pCursor,xConsumer,pUserData);
	return rc;
}